

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                *this)

{
  size_t capacity;
  long lVar1;
  size_t i;
  size_t sVar2;
  Layout LVar3;
  
  capacity = this->capacity_;
  if (capacity != 0) {
    lVar1 = 0;
    sVar2 = 0;
    do {
      if (-1 < this->ctrl_[sVar2]) {
        cs_impl::any::recycle((any *)((long)&this->slots_->mDat + lVar1));
        capacity = this->capacity_;
      }
      sVar2 = sVar2 + 1;
      lVar1 = lVar1 + 8;
    } while (sVar2 != capacity);
    LVar3 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<cs_impl::any>>
              ((allocator<cs_impl::any> *)&this->settings_,this->ctrl_,
               (LVar3.super_LayoutType<sizeof___(Ts),_signed_char,_cs_impl::any>.size_[0] + 7 &
               0xfffffffffffffff8) +
               LVar3.super_LayoutType<sizeof___(Ts),_signed_char,_cs_impl::any>.size_[1] * 8);
    this->ctrl_ = EmptyGroup()::empty_group;
    (this->settings_).
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_0UL,_false>
    .value = 0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots()
			{
				if (!capacity_) return;
				for (size_t i = 0; i != capacity_; ++i) {
					if (IsFull(ctrl_[i])) {
						PolicyTraits::destroy(&alloc_ref(), slots_ + i);
					}
				}
				auto layout = MakeLayout(capacity_);
				// Unpoison before returning the memory to the allocator.
				SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
				Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
				ctrl_ = EmptyGroup();
				slots_ = nullptr;
				size_ = 0;
				capacity_ = 0;
				growth_left() = 0;
			}